

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

char * llama_print_system_info(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  uint uVar10;
  string __str;
  size_type *local_90;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (llama_print_system_info()::s_abi_cxx11_ == '\0') {
    llama_print_system_info();
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&llama_print_system_info()::s_abi_cxx11_,0,
             llama_print_system_info()::s_abi_cxx11_._M_string_length,"",0);
  uVar5 = ggml_cpu_has_avx();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010cc41;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010cc41;
      }
      if (uVar7 < 10000) goto LAB_0010cc41;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010cc41:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"AVX = ",6);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_avx2();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010cdee;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010cdee;
      }
      if (uVar7 < 10000) goto LAB_0010cdee;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010cdee:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"AVX2 = ",7);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_avx512();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010cf93;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010cf93;
      }
      if (uVar7 < 10000) goto LAB_0010cf93;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010cf93:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"AVX512 = ",9);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_fma();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d138;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d138;
      }
      if (uVar7 < 10000) goto LAB_0010d138;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d138:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"FMA = ",6);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_neon();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d2dd;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d2dd;
      }
      if (uVar7 < 10000) goto LAB_0010d2dd;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d2dd:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"NEON = ",7);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_arm_fma();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d482;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d482;
      }
      if (uVar7 < 10000) goto LAB_0010d482;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d482:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"ARM_FMA = ",10);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_f16c();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d627;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d627;
      }
      if (uVar7 < 10000) goto LAB_0010d627;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d627:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"F16C = ",7);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_fp16_va();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d7cc;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d7cc;
      }
      if (uVar7 < 10000) goto LAB_0010d7cc;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d7cc:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"FP16_VA = ",10);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_wasm_simd();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010d971;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010d971;
      }
      if (uVar7 < 10000) goto LAB_0010d971;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010d971:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"WASM_SIMD = ",0xc);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_blas();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010db16;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010db16;
      }
      if (uVar7 < 10000) goto LAB_0010db16;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010db16:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"BLAS = ",7);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_sse3();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010dcbb;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010dcbb;
      }
      if (uVar7 < 10000) goto LAB_0010dcbb;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010dcbb:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"SSE3 = ",7);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar5 = ggml_cpu_has_vsx();
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar10 = 1;
  if (9 < uVar3) {
    uVar9 = (ulong)uVar3;
    uVar4 = 4;
    do {
      uVar10 = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0010de60;
      }
      if (uVar7 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0010de60;
      }
      if (uVar7 < 10000) goto LAB_0010de60;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar10 + 4;
    } while (99999 < uVar7);
    uVar10 = uVar10 + 1;
  }
LAB_0010de60:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)(uVar10 + -((int)uVar5 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),uVar10,uVar3);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_70,0,0,"VSX = ",6);
  local_50._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar8) {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," | ");
  local_90 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar8 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90 == paVar8) {
    local_80 = paVar8->_M_allocated_capacity;
    uStack_78 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_90 = &local_80;
  }
  else {
    local_80 = paVar8->_M_allocated_capacity;
  }
  sVar2 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&llama_print_system_info()::s_abi_cxx11_,(char *)local_90,sVar2);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return llama_print_system_info()::s_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;

    s  = "";
    s += "AVX = "       + std::to_string(ggml_cpu_has_avx())       + " | ";
    s += "AVX2 = "      + std::to_string(ggml_cpu_has_avx2())      + " | ";
    s += "AVX512 = "    + std::to_string(ggml_cpu_has_avx512())    + " | ";
    s += "FMA = "       + std::to_string(ggml_cpu_has_fma())       + " | ";
    s += "NEON = "      + std::to_string(ggml_cpu_has_neon())      + " | ";
    s += "ARM_FMA = "   + std::to_string(ggml_cpu_has_arm_fma())   + " | ";
    s += "F16C = "      + std::to_string(ggml_cpu_has_f16c())      + " | ";
    s += "FP16_VA = "   + std::to_string(ggml_cpu_has_fp16_va())   + " | ";
    s += "WASM_SIMD = " + std::to_string(ggml_cpu_has_wasm_simd()) + " | ";
    s += "BLAS = "      + std::to_string(ggml_cpu_has_blas())      + " | ";
    s += "SSE3 = "      + std::to_string(ggml_cpu_has_sse3())      + " | ";
    s += "VSX = "       + std::to_string(ggml_cpu_has_vsx())       + " | ";

    return s.c_str();
}